

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O0

int WebRtcNs_set_policy_core(NoiseSuppressionC *self,int mode)

{
  int mode_local;
  NoiseSuppressionC *self_local;
  
  if (mode == 0) {
    self->overdrive = 1.0;
    self->denoiseBound = 0.5;
    self->gainmap = 0;
  }
  else if (mode == 1) {
    self->overdrive = 1.0;
    self->denoiseBound = 0.25;
    self->gainmap = 1;
  }
  else if (mode == 2) {
    self->overdrive = 1.1;
    self->denoiseBound = 0.125;
    self->gainmap = 1;
  }
  else {
    if (mode != 3) {
      return -1;
    }
    self->overdrive = 1.25;
    self->denoiseBound = 0.09;
    self->gainmap = 1;
  }
  self->aggrMode = mode;
  return 0;
}

Assistant:

int WebRtcNs_set_policy_core(NoiseSuppressionC *self, int mode) {
    // Allow for modes: 0, 1, 2, 3.
    if (mode == 0) {
        self->overdrive = 1.f;
        self->denoiseBound = 0.5f;
        self->gainmap = 0;
    } else if (mode == 1) {
        // self->overdrive = 1.25f;
        self->overdrive = 1.f;
        self->denoiseBound = 0.25f;
        self->gainmap = 1;
    } else if (mode == 2) {
        // self->overdrive = 1.25f;
        self->overdrive = 1.1f;
        self->denoiseBound = 0.125f;
        self->gainmap = 1;
    } else if (mode == 3) {
        // self->overdrive = 1.3f;
        self->overdrive = 1.25f;
        self->denoiseBound = 0.09f;
        self->gainmap = 1;
    } else {
        return -1;
    }
    self->aggrMode = mode;
    return 0;
}